

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  char cVar1;
  u16 uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  MemPage *pMVar6;
  long lVar7;
  ushort uVar8;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    cVar1 = pCur->iPage;
    pMVar6 = pCur->apPage[cVar1];
    uVar2 = pCur->aiIdx[cVar1];
    uVar8 = uVar2 + 1;
    pCur->aiIdx[cVar1] = uVar8;
    if (pMVar6->nCell <= uVar8) {
      pCur->aiIdx[cVar1] = uVar2;
      iVar5 = btreeNext(pCur,pRes);
      return iVar5;
    }
    if (pMVar6->leaf != '\0') {
      return 0;
    }
    do {
      pMVar6 = pCur->apPage[pCur->iPage];
      if (pMVar6->leaf != '\0') {
        return 0;
      }
      uVar3 = *(uint *)(pMVar6->aData +
                       (CONCAT11(pMVar6->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                 pMVar6->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                       pMVar6->maskPage));
      iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
    } while (iVar5 == 0);
    return iVar5;
  }
  bVar4 = pCur->eState;
  if (bVar4 != 1) {
    if (2 < bVar4) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 0) {
      *pRes = 1;
      return 0;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar5) {
        return 0;
      }
    }
  }
  lVar7 = (long)pCur->iPage;
  pMVar6 = pCur->apPage[lVar7];
  uVar8 = pCur->aiIdx[lVar7] + 1;
  pCur->aiIdx[lVar7] = uVar8;
  if (uVar8 < pMVar6->nCell) {
    if (pMVar6->leaf == '\0') {
LAB_001391ed:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar6->leaf == '\0') {
      uVar3 = *(uint *)(pMVar6->aData + (ulong)pMVar6->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_001391ed;
    }
    do {
      if ((char)lVar7 == '\0') {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->iPage = (char)lVar7 + -1;
      sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
      lVar7 = (long)pCur->iPage;
      pMVar6 = pCur->apPage[lVar7];
    } while (pMVar6->nCell <= pCur->aiIdx[lVar7]);
    if (pMVar6->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,pRes);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}